

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::CompilerPass::specs
          (CompilerPass *this,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  bool bVar1;
  reference pCVar2;
  long *in_RDI;
  ComprehensionSpec *spec;
  iterator __end2;
  iterator __begin2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Kind in_stack_ffffffffffffffc4;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ComprehensionSpec *)
       std::
       vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
             ::operator*(local_20);
    (**(code **)(*in_RDI + 8))(in_RDI,&pCVar2->openFodder);
    in_stack_ffffffffffffffc4 = pCVar2->kind;
    if (in_stack_ffffffffffffffc4 == FOR) {
      (**(code **)(*in_RDI + 8))(in_RDI,&pCVar2->varFodder);
      (**(code **)(*in_RDI + 8))(in_RDI,&pCVar2->inFodder);
      (**(code **)(*in_RDI + 0x30))(in_RDI,&pCVar2->expr);
    }
    else if (in_stack_ffffffffffffffc4 == IF) {
      (**(code **)(*in_RDI + 0x30))(in_RDI,&pCVar2->expr);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void CompilerPass::specs(std::vector<ComprehensionSpec> &specs)
{
    for (auto &spec : specs) {
        fodder(spec.openFodder);
        switch (spec.kind) {
            case ComprehensionSpec::FOR:
                fodder(spec.varFodder);
                fodder(spec.inFodder);
                expr(spec.expr);
                break;
            case ComprehensionSpec::IF: expr(spec.expr); break;
        }
    }
}